

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

void __thiscall testing::internal::MutexBase::Unlock(MutexBase *this)

{
  ostream *poVar1;
  pthread_mutex_t *in_RDI;
  int gtest_error;
  int in_stack_0000003c;
  char *in_stack_00000040;
  GTestLogSeverity in_stack_0000004c;
  GTestLog *in_stack_00000050;
  GTestLog *this_00;
  GTestLog local_10;
  int local_c;
  
  in_RDI[1].__size[0] = '\0';
  local_c = pthread_mutex_unlock(in_RDI);
  if (local_c != 0) {
    this_00 = &local_10;
    GTestLog::GTestLog(in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_0000003c);
    poVar1 = GTestLog::GetStream(this_00);
    poVar1 = std::operator<<(poVar1,"pthread_mutex_unlock(&mutex_)");
    poVar1 = std::operator<<(poVar1,"failed with error ");
    std::ostream::operator<<(poVar1,local_c);
    GTestLog::~GTestLog(this_00);
  }
  return;
}

Assistant:

void Unlock() {
    // Since the lock is being released the owner_ field should no longer be
    // considered valid. We don't protect writing to has_owner_ here, as it's
    // the caller's responsibility to ensure that the current thread holds the
    // mutex when this is called.
    has_owner_ = false;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_unlock(&mutex_));
  }